

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,StmtListNode *stmtListNode)

{
  StmtListNode *pSVar1;
  StmtNode *pSVar2;
  char cVar3;
  
  pSVar1 = stmtListNode->next;
  if (pSVar1 == (StmtListNode *)0x0) {
    cVar3 = '\0';
  }
  else {
    (*(pSVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pSVar1,this);
    cVar3 = stmtListNode->next->returnAtt;
  }
  pSVar2 = stmtListNode->stmt;
  if (pSVar2 != (StmtNode *)0x0) {
    (*(pSVar2->super_ASTNode)._vptr_ASTNode[3])(pSVar2,this);
    if (cVar3 == '\0') {
      cVar3 = (char)*(undefined4 *)&(stmtListNode->stmt->super_ASTNode).field_0xc;
    }
    else {
      cVar3 = true;
    }
  }
  stmtListNode->returnAtt = (bool)cVar3;
  return;
}

Assistant:

void SemanticTypes::visit(StmtListNode *stmtListNode) {

    bool aux_return = false;
    if (stmtListNode->getNext()) {
        stmtListNode->getNext()->accept(this);
        aux_return = stmtListNode->getNext()->isReturn();
    }

    if (stmtListNode->getStmt()) {
        stmtListNode->getStmt()->accept(this);
        stmtListNode->setReturn(stmtListNode->getStmt()->isReturn());
        aux_return = aux_return || stmtListNode->isReturn();
    }

    stmtListNode->setReturn(aux_return);

}